

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

Gia_Man_t * Gia_QbfCofactor(Gia_Man_t *p,int nPars,Vec_Int_t *vValues,Vec_Int_t *vParMap)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  Vec_Int_t *p_01;
  
  if (p->vCis->nSize - p->nRegs != vValues->nSize + nPars) {
    __assert_fail("Gia_ManPiNum(p) == nPars + Vec_IntSize(vValues)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                  ,0x266,"Gia_Man_t *Gia_QbfCofactor(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  iVar7 = 0;
  do {
    if ((p->vCis->nSize - p->nRegs <= iVar7) ||
       (pGVar5 = Gia_ManCi(p,iVar7), pGVar5 == (Gia_Obj_t *)0x0)) {
      iVar7 = 0;
      while ((iVar7 < p->nObjs && (pGVar5 = Gia_ManObj(p,iVar7), pGVar5 != (Gia_Obj_t *)0x0))) {
        if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
          iVar3 = Gia_ObjFanin0Copy(pGVar5);
          iVar2 = Gia_ObjFanin1Copy(pGVar5);
          uVar1 = Gia_ManHashAnd(p_00,iVar3,iVar2);
          pGVar5->Value = uVar1;
        }
        iVar7 = iVar7 + 1;
      }
      iVar7 = 0;
      while ((iVar7 < p->vCos->nSize && (pGVar5 = Gia_ManCo(p,iVar7), pGVar5 != (Gia_Obj_t *)0x0)))
      {
        iVar3 = Gia_ObjFanin0Copy(pGVar5);
        uVar1 = Gia_ManAppendCo(p_00,iVar3);
        pGVar5->Value = uVar1;
        iVar7 = iVar7 + 1;
      }
      pGVar6 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      if (pGVar6->vCis->nSize - pGVar6->nRegs != nPars) {
        __assert_fail("Gia_ManPiNum(pNew) == nPars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                      ,0x27a,
                      "Gia_Man_t *Gia_QbfCofactor(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
      }
      return pGVar6;
    }
    if (iVar7 < nPars) {
      uVar1 = Gia_ManAppendCi(p_00);
      pGVar5->Value = uVar1;
      iVar2 = Vec_IntEntry(vParMap,iVar7);
      p_01 = vParMap;
      iVar3 = iVar7;
      if (iVar2 != -1) goto LAB_0061147e;
    }
    else {
      p_01 = vValues;
      iVar3 = iVar7 - nPars;
LAB_0061147e:
      uVar1 = Vec_IntEntry(p_01,iVar3);
      pGVar5->Value = uVar1;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_QbfCofactor( Gia_Man_t * p, int nPars, Vec_Int_t * vValues, Vec_Int_t * vParMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj; int i;
    assert( Gia_ManPiNum(p) == nPars + Vec_IntSize(vValues) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        if ( i < nPars )
        {
            pObj->Value = Gia_ManAppendCi(pNew);
            if ( Vec_IntEntry(vParMap, i) != -1 )
                pObj->Value = Vec_IntEntry(vParMap, i);
        }
        else
            pObj->Value = Vec_IntEntry(vValues, i - nPars);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == nPars );
    return pNew;
}